

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall kj::ArrayBuilder<unsigned_char>::dispose(ArrayBuilder<unsigned_char> *this)

{
  uchar *puVar1;
  RemoveConst<unsigned_char> *pRVar2;
  uchar *puVar3;
  
  puVar1 = this->ptr;
  if (puVar1 != (uchar *)0x0) {
    pRVar2 = this->pos;
    puVar3 = this->endPtr;
    this->ptr = (uchar *)0x0;
    this->pos = (RemoveConst<unsigned_char> *)0x0;
    this->endPtr = (uchar *)0x0;
    (*(code *)**(undefined8 **)this->disposer)
              (this->disposer,puVar1,1,(long)pRVar2 - (long)puVar1,(long)puVar3 - (long)puVar1,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }